

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * string_proper(char *argument)

{
  char cVar1;
  bool bVar2;
  char *s;
  char *argument_local;
  
  s = argument;
  while (*s != '\0') {
    if (*s == ' ') {
      s = s + 1;
    }
    else {
      if ((*s < 'a') || ('z' < *s)) {
        cVar1 = *s;
      }
      else {
        cVar1 = *s + -0x20;
      }
      *s = cVar1;
      while( true ) {
        bVar2 = false;
        if (*s != ' ') {
          bVar2 = *s != '\0';
        }
        if (!bVar2) break;
        s = s + 1;
      }
    }
  }
  return argument;
}

Assistant:

char *string_proper(char *argument)
{
	char *s;

	s = argument;

	while (*s != '\0')
	{
		if (*s != ' ')
		{
			*s = UPPER(*s);

			while (*s != ' ' && *s != '\0')
			{
				s++;
			}
		}
		else
		{
			s++;
		}
	}

	return argument;
}